

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O1

void __thiscall
TPZElementMatrixT<std::complex<double>_>::ApplyConstraints
          (TPZElementMatrixT<std::complex<double>_> *this)

{
  TPZStack<long,_10> *this_00;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *plVar1;
  TPZBlock *this_01;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  TNode *pTVar10;
  long lVar11;
  complex<double> *pcVar12;
  double dVar13;
  undefined8 uVar14;
  double dVar15;
  int iVar16;
  _Self __tmp;
  _Base_ptr p_Var17;
  TPZConnect *pTVar18;
  complex<double> *pcVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  _List_node_base *p_Var30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  complex<double> *pcVar37;
  TPZDepend *pTVar38;
  long lVar39;
  ulong uVar40;
  set<long,_std::less<long>,_std::allocator<long>_> connectlist;
  TPZVec<int> DependenceOrder;
  set<long,_std::less<long>,_std::allocator<long>_> origlist;
  long local_1a0;
  long local_198;
  long local_188;
  long local_160;
  long local_158;
  int local_134;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b0;
  TPZVec<int> local_80;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  if ((this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.fRow == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"this->fMat not initialized",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  this_00 = &(this->super_TPZElementMatrix).fConstrConnect;
  uVar24 = (uint)(this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
                 super_TPZVec<long>.fNElements;
  TPZManVector<long,_10>::Resize(&this_00->super_TPZManVector<long,_10>,(long)(int)uVar24);
  if (uVar24 != 0) {
    local_60._M_impl._0_8_ = 0;
    TPZVec<long>::Fill((TPZVec<long> *)this_00,(long *)&local_60,0,-1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)uVar24) {
    uVar25 = (ulong)(uVar24 & 0x7fffffff);
    lVar29 = 0;
    do {
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 &local_b0,
                 (long *)((long)(this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>
                                .super_TPZVec<long>.fStore + lVar29));
      lVar29 = lVar29 + 8;
      uVar25 = uVar25 - 1;
    } while (uVar25 != 0);
  }
  plVar1 = &(this->super_TPZElementMatrix).fOneRestraints;
  p_Var30 = (this->super_TPZElementMatrix).fOneRestraints.
            super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  if (p_Var30 != (_List_node_base *)plVar1) {
    do {
      if (0 < (long)p_Var30[2]._M_next) {
        lVar29 = 0;
        lVar36 = 0;
        do {
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)&local_b0,(long *)((long)&(p_Var30[1]._M_prev)->_M_next + lVar29));
          lVar36 = lVar36 + 1;
          lVar29 = lVar29 + 0x10;
        } while (lVar36 < (long)p_Var30[2]._M_next);
      }
      p_Var30 = p_Var30->_M_next;
    } while (p_Var30 != (_List_node_base *)plVar1);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::operator=
            (&local_60,&local_b0);
  TPZConnect::BuildConnectList
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_b0,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,
             (this->super_TPZElementMatrix).fMesh);
  (*(this_00->super_TPZManVector<long,_10>).super_TPZVec<long>._vptr_TPZVec[3])
            (this_00,local_b0._M_impl.super__Rb_tree_header._M_node_count);
  if (local_b0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    plVar9 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
             super_TPZVec<long>.fStore;
    uVar25 = 0;
    p_Var17 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      plVar9[uVar25] = *(long *)(p_Var17 + 1);
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
      uVar25 = uVar25 + 1;
    } while (uVar25 < local_b0._M_impl.super__Rb_tree_header._M_node_count);
  }
  uVar25 = (this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
           super_TPZVec<long>.fNElements;
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  local_80.fStore = (int *)0x0;
  local_80.fNElements = 0;
  local_80.fNAlloc = 0;
  TPZElementMatrix::BuildDependencyOrder
            (&this->super_TPZElementMatrix,(TPZVec<long> *)this_00,&local_80,
             (this->super_TPZElementMatrix).fMesh);
  this_01 = &this->fConstrBlock;
  uVar24 = (uint)uVar25;
  TPZBlock::SetNBlocks(this_01,uVar24);
  if ((int)uVar24 < 1) {
    local_1a0 = 0;
  }
  else {
    uVar26 = 0;
    local_1a0 = 0;
    do {
      pTVar18 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (&(((this->super_TPZElementMatrix).fMesh)->fConnectVec).
                            super_TPZChunkVector<TPZConnect,_10>,
                           (this->super_TPZElementMatrix).fConstrConnect.
                           super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar26]);
      iVar16 = TPZConnect::NDof(pTVar18,(this->super_TPZElementMatrix).fMesh);
      if (iVar16 != (uint)(pTVar18->field_2).fCompose.fNState * pTVar18->fNShape) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZElementMatrixT.cpp"
                   ,0xbb);
      }
      TPZBlock::Set(this_01,(int)uVar26,iVar16,-1);
      local_1a0 = local_1a0 + iVar16;
      uVar26 = uVar26 + 1;
    } while ((uVar24 & 0x7fffffff) != uVar26);
  }
  TPZBlock::Resequence(this_01,0);
  (this->fConstrBlock).fpMatrix = (TPZBaseMatrix *)&this->fConstrMat;
  lVar29 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  lVar36 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol *
           (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
           super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  if ((this->super_TPZElementMatrix).fType == EK) {
    uVar26 = local_1a0 * local_1a0;
    lVar31 = local_1a0;
    if (uVar26 - lVar36 != 0) {
      pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
      if ((pcVar19 != (complex<double> *)0x0) &&
         (pcVar19 != (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fGiven)) {
        operator_delete__(pcVar19);
      }
      pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
      if ((pcVar19 == (complex<double> *)0x0) ||
         (lVar36 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fSize,
         uVar26 - lVar36 != 0 && lVar36 <= (long)uVar26)) {
        if (local_1a0 == 0) {
          pcVar19 = (complex<double> *)0x0;
        }
        else {
          pcVar19 = (complex<double> *)operator_new__(-(ulong)(uVar26 >> 0x3c != 0) | uVar26 * 0x10)
          ;
          memset(pcVar19,0,uVar26 * 0x10);
        }
      }
      (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem = pcVar19;
      if ((local_1a0 != 0) && (pcVar19 == (complex<double> *)0x0)) {
        TPZFMatrix<std::complex<double>_>::Error("Resize <memory allocation error>.",(char *)0x0);
      }
    }
  }
  else {
    uVar26 = lVar29 * local_1a0;
    lVar31 = lVar29;
    if (uVar26 - lVar36 != 0) {
      pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem;
      if ((pcVar19 != (complex<double> *)0x0) &&
         (pcVar19 != (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fGiven)) {
        operator_delete__(pcVar19);
      }
      pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
      if ((pcVar19 == (complex<double> *)0x0) ||
         (lVar36 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fSize,
         uVar26 - lVar36 != 0 && lVar36 <= (long)uVar26)) {
        if (uVar26 == 0) {
          pcVar19 = (complex<double> *)0x0;
        }
        else {
          pcVar19 = (complex<double> *)operator_new__(-(ulong)(uVar26 >> 0x3c != 0) | uVar26 * 0x10)
          ;
          memset(pcVar19,0,uVar26 * 0x10);
        }
      }
      (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem = pcVar19;
      if ((uVar26 != 0) && (pcVar19 == (complex<double> *)0x0)) {
        TPZFMatrix<std::complex<double>_>::Error("Resize <memory allocation error>.",(char *)0x0);
      }
    }
  }
  (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
  super_TPZBaseMatrix.fRow = local_1a0;
  (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
  super_TPZBaseMatrix.fCol = lVar31;
  (*(this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xf])();
  uVar26 = (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.super_TPZVec<long>.
           fNElements;
  if (0 < (int)uVar26) {
    uVar26 = uVar26 & 0x7fffffff;
    uVar23 = 0;
    do {
      if ((int)uVar24 < 1) {
        uVar40 = 0;
      }
      else {
        uVar20 = 0;
        do {
          uVar40 = uVar20;
          if ((this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
              super_TPZVec<long>.fStore[uVar20] ==
              (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
              super_TPZVec<long>.fStore[uVar23]) break;
          uVar20 = uVar20 + 1;
          uVar40 = uVar25 & 0xffffffff;
        } while ((uVar25 & 0x7fffffff) != uVar20);
        uVar40 = uVar40 & 0xffffffff;
      }
      pTVar10 = (this->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      lVar31 = (long)pTVar10[uVar23].pos;
      iVar16 = pTVar10[uVar23].dim;
      lVar36 = iVar16 + lVar31;
      local_158 = (long)(this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar40].pos
      ;
      if ((this->super_TPZElementMatrix).fType == EF) {
        if (0 < iVar16) {
          do {
            if (0 < lVar29) {
              lVar33 = 0;
              do {
                if (((lVar31 < 0) ||
                    ((this->fMat).super_TPZFMatrix<std::complex<double>_>.
                     super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar31)) ||
                   ((this->fMat).super_TPZFMatrix<std::complex<double>_>.
                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar33)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((local_158 < 0) ||
                    ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                     super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= local_158))
                   || ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar33)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar37 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                          (this->fMat).super_TPZFMatrix<std::complex<double>_>.
                          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar33 +
                          lVar31;
                uVar14 = *(undefined8 *)(pcVar37->_M_value + 8);
                pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                          (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar33 +
                          local_158;
                *(undefined8 *)pcVar19->_M_value = *(undefined8 *)pcVar37->_M_value;
                *(undefined8 *)(pcVar19->_M_value + 8) = uVar14;
                lVar33 = lVar33 + 1;
              } while (lVar29 != lVar33);
            }
            lVar31 = lVar31 + 1;
            local_158 = local_158 + 1;
          } while (lVar31 < lVar36);
        }
      }
      else {
        uVar40 = 0;
        do {
          if ((int)uVar24 < 1) {
            uVar20 = 0;
          }
          else {
            uVar34 = 0;
            do {
              uVar20 = uVar34;
              if ((this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                  super_TPZVec<long>.fStore[uVar34] ==
                  (this->super_TPZElementMatrix).fConnect.super_TPZManVector<long,_10>.
                  super_TPZVec<long>.fStore[uVar40]) break;
              uVar34 = uVar34 + 1;
              uVar20 = uVar25;
            } while ((uVar25 & 0x7fffffff) != uVar34);
          }
          if ((uint)uVar20 == uVar24) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"node not found in node list",0x1b);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
          }
          if (0 < iVar16) {
            pTVar10 = (this->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
            lVar21 = (long)pTVar10[uVar40].pos;
            iVar7 = pTVar10[uVar40].dim;
            iVar8 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                    [uVar20 & 0xffffffff].pos;
            lVar33 = lVar31;
            lVar28 = local_158;
            do {
              lVar22 = (long)iVar8;
              lVar32 = lVar21;
              if (0 < iVar7) {
                do {
                  if ((((lVar33 < 0) ||
                       ((this->fMat).super_TPZFMatrix<std::complex<double>_>.
                        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar33))
                      || (lVar32 < 0)) ||
                     ((this->fMat).super_TPZFMatrix<std::complex<double>_>.
                      super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar32)) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if (((lVar28 < 0) ||
                      ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar28))
                     || ((lVar22 < 0 ||
                         ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar22)
                         ))) {
                    TPZFMatrix<std::complex<double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pcVar37 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                            (this->fMat).super_TPZFMatrix<std::complex<double>_>.
                            super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar32
                            + lVar33;
                  uVar14 = *(undefined8 *)(pcVar37->_M_value + 8);
                  pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.fElem +
                            (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                            super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar22
                            + lVar28;
                  *(undefined8 *)pcVar19->_M_value = *(undefined8 *)pcVar37->_M_value;
                  *(undefined8 *)(pcVar19->_M_value + 8) = uVar14;
                  lVar32 = lVar32 + 1;
                  lVar22 = lVar22 + 1;
                } while (lVar32 < iVar7 + lVar21);
              }
              lVar33 = lVar33 + 1;
              lVar28 = lVar28 + 1;
            } while (lVar33 < lVar36);
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 != uVar26);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar26);
  }
  if (0 < (int)uVar24) {
    iVar16 = 0;
    local_134 = 0;
    do {
      uVar26 = 0;
      do {
        pTVar18 = TPZChunkVector<TPZConnect,_10>::operator[]
                            (&(((this->super_TPZElementMatrix).fMesh)->fConnectVec).
                              super_TPZChunkVector<TPZConnect,_10>,
                             (this->super_TPZElementMatrix).fConstrConnect.
                             super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[uVar26]);
        if (local_80.fStore[uVar26] == iVar16) {
          pTVar38 = pTVar18->fDependList;
          if (pTVar38 != (TPZDepend *)0x0) {
            pTVar10 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
            lVar36 = (long)pTVar10[uVar26].pos;
            iVar7 = pTVar10[uVar26].dim;
            do {
              uVar23 = 0;
              do {
                if ((this->super_TPZElementMatrix).fConstrConnect.super_TPZManVector<long,_10>.
                    super_TPZVec<long>.fStore[uVar23] == pTVar38->fDepConnectIndex)
                goto LAB_0116cf03;
                uVar23 = uVar23 + 1;
              } while ((uVar24 & 0x7fffffff) != uVar23);
              uVar23 = uVar25 & 0xffffffff;
LAB_0116cf03:
              if ((uint)uVar23 == uVar24) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"node not found in node list",0x1b);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                std::ostream::put(-0x58);
                std::ostream::flush();
              }
              pTVar10 = (this->fConstrBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
              lVar31 = (long)pTVar10[uVar23 & 0xffffffff].pos;
              iVar8 = pTVar10[uVar23 & 0xffffffff].dim;
              bVar6 = (pTVar18->field_2).fCompose.fNState;
              uVar23 = (ulong)bVar6;
              if (0 < iVar7) {
                lVar33 = (ulong)bVar6 * 0x10;
                local_188 = lVar36;
                local_160 = lVar36 << 4;
                do {
                  if (0 < iVar8) {
                    lVar21 = (local_188 - lVar36) / (long)uVar23;
                    lVar28 = lVar31;
                    local_198 = lVar31 << 4;
                    do {
                      lVar22 = (lVar28 - lVar31) / (long)uVar23;
                      if (((lVar21 < 0) ||
                          ((pTVar38->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fRow <= lVar21)) ||
                         ((lVar22 < 0 ||
                          ((pTVar38->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                           super_TPZBaseMatrix.fCol <= lVar22)))) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      dVar5 = (pTVar38->fDepMatrix).super_TPZFMatrix<double>.fElem
                              [lVar22 * (pTVar38->fDepMatrix).super_TPZFMatrix<double>.
                                        super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar21];
                      if ((this->super_TPZElementMatrix).fType == EK) {
                        if (0 < local_1a0) {
                          lVar32 = 0;
                          lVar22 = 0;
                          do {
                            if (uVar23 != 0) {
                              lVar39 = 0;
                              lVar27 = local_188;
                              lVar35 = lVar28;
                              do {
                                if (((lVar27 < 0) ||
                                    ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                     super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow
                                     <= lVar27)) ||
                                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol
                                    <= lVar22)) {
                                  TPZFMatrix<std::complex<double>_>::Error
                                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds")
                                  ;
                                  pzinternal::DebugStopImpl
                                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                             ,0x26d);
                                }
                                lVar11 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                         fRow;
                                pdVar2 = (double *)
                                         (((this->fConstrMat).
                                           super_TPZFMatrix<std::complex<double>_>.fElem)->_M_value
                                         + lVar39 + local_160 + lVar32 * lVar11);
                                dVar15 = pdVar2[1];
                                if (((lVar35 < 0) || (lVar11 <= lVar35)) ||
                                   ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol
                                    <= lVar22)) {
                                  TPZFMatrix<std::complex<double>_>::Error
                                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds")
                                  ;
                                  pzinternal::DebugStopImpl
                                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                             ,0x26d);
                                }
                                pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>
                                          .fElem;
                                lVar11 = local_198 +
                                         (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                         super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                         fRow * lVar32;
                                pdVar3 = (double *)(pcVar19->_M_value + lVar39 + lVar11);
                                dVar13 = pdVar3[1];
                                pdVar4 = (double *)(pcVar19->_M_value + lVar39 + lVar11);
                                *pdVar4 = *pdVar3 + *pdVar2 * dVar5;
                                pdVar4[1] = dVar13 + dVar15 * dVar5;
                                lVar39 = lVar39 + 0x10;
                                lVar35 = lVar35 + 1;
                                lVar27 = lVar27 + 1;
                              } while (lVar33 != lVar39);
                            }
                            lVar22 = lVar22 + 1;
                            lVar32 = lVar32 + 0x10;
                          } while (lVar22 != local_1a0);
                        }
                      }
                      else if (0 < lVar29) {
                        lVar32 = 0;
                        lVar22 = 0;
                        do {
                          if (uVar23 != 0) {
                            uVar40 = 0;
                            lVar27 = local_160;
                            lVar35 = local_198;
                            do {
                              if ((((long)(local_188 + uVar40) < 0) ||
                                  ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                   super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow
                                   <= (long)(local_188 + uVar40))) ||
                                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
                                  lVar22)) {
                                TPZFMatrix<std::complex<double>_>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              lVar39 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                       fRow;
                              pdVar2 = (double *)
                                       (((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                        fElem)->_M_value + lVar27 + lVar32 * lVar39);
                              dVar15 = pdVar2[1];
                              if ((((long)(lVar28 + uVar40) < 0) ||
                                  (lVar39 <= (long)(lVar28 + uVar40))) ||
                                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
                                  lVar22)) {
                                TPZFMatrix<std::complex<double>_>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              lVar39 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                       fRow * lVar32;
                              pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                        fElem;
                              pdVar3 = (double *)(pcVar19->_M_value + lVar35 + lVar39);
                              dVar13 = pdVar3[1];
                              pdVar4 = (double *)(pcVar19->_M_value + lVar35 + lVar39);
                              *pdVar4 = *pdVar3 + *pdVar2 * dVar5;
                              pdVar4[1] = dVar13 + dVar15 * dVar5;
                              uVar40 = uVar40 + 1;
                              lVar35 = lVar35 + 0x10;
                              lVar27 = lVar27 + 0x10;
                            } while (uVar23 != uVar40);
                          }
                          lVar22 = lVar22 + 1;
                          lVar32 = lVar32 + 0x10;
                        } while (lVar22 != lVar29);
                      }
                      lVar28 = lVar28 + uVar23;
                      local_198 = local_198 + lVar33;
                    } while (lVar28 < iVar8 + lVar31);
                  }
                  local_188 = local_188 + uVar23;
                  local_160 = local_160 + lVar33;
                } while (local_188 < iVar7 + lVar36);
              }
              if ((this->super_TPZElementMatrix).fType == EK && 0 < iVar7) {
                local_198 = lVar36;
                do {
                  if (0 < iVar8) {
                    lVar28 = (local_198 - lVar36) / (long)uVar23;
                    lVar33 = lVar31;
                    do {
                      lVar21 = (lVar33 - lVar31) / (long)uVar23;
                      if ((((lVar28 < 0) ||
                           ((pTVar38->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                            super_TPZBaseMatrix.fRow <= lVar28)) || (lVar21 < 0)) ||
                         ((pTVar38->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fCol <= lVar21)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      if (0 < local_1a0) {
                        dVar5 = (pTVar38->fDepMatrix).super_TPZFMatrix<double>.fElem
                                [lVar21 * (pTVar38->fDepMatrix).super_TPZFMatrix<double>.
                                          super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar28]
                        ;
                        lVar21 = 0;
                        do {
                          if (bVar6 != 0) {
                            uVar40 = 0;
                            do {
                              lVar22 = local_198 + uVar40;
                              if ((((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                    super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow
                                    <= lVar21) || (lVar22 < 0)) ||
                                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
                                  lVar22)) {
                                TPZFMatrix<std::complex<double>_>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              lVar32 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                       super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                                       fRow;
                              pcVar19 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                        fElem + lVar22 * lVar32 + lVar21;
                              dVar15 = *(double *)(pcVar19->_M_value + 8);
                              lVar22 = uVar40 + lVar33;
                              if (((lVar32 <= lVar21) || (lVar22 < 0)) ||
                                 ((this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                  super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
                                  lVar22)) {
                                TPZFMatrix<std::complex<double>_>::Error
                                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                                pzinternal::DebugStopImpl
                                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                           ,0x26d);
                              }
                              lVar22 = lVar22 * (this->fConstrMat).
                                                super_TPZFMatrix<std::complex<double>_>.
                                                super_TPZMatrix<std::complex<double>_>.
                                                super_TPZBaseMatrix.fRow;
                              pcVar12 = (this->fConstrMat).super_TPZFMatrix<std::complex<double>_>.
                                        fElem;
                              pcVar37 = pcVar12 + lVar22 + lVar21;
                              dVar13 = *(double *)(pcVar37->_M_value + 8);
                              pcVar12 = pcVar12 + lVar22 + lVar21;
                              *(double *)pcVar12->_M_value =
                                   *(double *)pcVar37->_M_value +
                                   *(double *)pcVar19->_M_value * dVar5;
                              *(double *)(pcVar12->_M_value + 8) = dVar13 + dVar15 * dVar5;
                              uVar40 = uVar40 + 1;
                            } while (uVar23 != uVar40);
                          }
                          lVar21 = lVar21 + 1;
                        } while (lVar21 != local_1a0);
                      }
                      lVar33 = lVar33 + uVar23;
                    } while (lVar33 < iVar8 + lVar31);
                  }
                  local_198 = local_198 + uVar23;
                } while (local_198 < iVar7 + lVar36);
              }
              pTVar38 = pTVar38->fNext;
            } while (pTVar38 != (TPZDepend *)0x0);
          }
          local_134 = local_134 + 1;
          if ((this->super_TPZElementMatrix).fOneRestraints.
              super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl.
              _M_node._M_size != 0) {
            (*(this->super_TPZElementMatrix)._vptr_TPZElementMatrix[7])(this,uVar26 & 0xffffffff);
          }
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != (uVar24 & 0x7fffffff));
      iVar16 = iVar16 + 1;
    } while (local_134 < (int)uVar24);
  }
  local_80._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_80.fStore != (int *)0x0) {
    operator_delete__(local_80.fStore);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_b0);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::ApplyConstraints(){
	
	if (this->fMat.Rows() == 0){
		LOGPZ_FATAL(logger, "this->fMat not initialized");
	}
	
	int totalnodes= this->NConnects();
	this->fConstrConnect.Resize(totalnodes);
	if(totalnodes) this->fConstrConnect.Fill(0,0);
	int in;
    std::set<int64_t> origlist,connectlist;
	for(in=0; in<totalnodes; in++) connectlist.insert(this->fConnect[in]);
    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        for (int c=0; c< it->fFaces.size(); c++) {
            connectlist.insert(it->fFaces[c].first);
        }
    }
    origlist = connectlist;
	// total number of nodes of the constrained element
	TPZConnect::BuildConnectList(connectlist, origlist, *this->fMesh);
    this->fConstrConnect.resize(connectlist.size());
    std::set<int64_t>::iterator it = connectlist.begin();
    for (int64_t i=0; i<connectlist.size(); i++) {
        fConstrConnect[i] = *it;
        it++;
    }
	totalnodes = this->fConstrConnect.NElements();
	
	// compute the list of nodes and their proper order of processing
	TPZVec<int> DependenceOrder;
	// this->fConstrNod, totalnodes and DependenceOrder
	// are initialized using codes documented above
	BuildDependencyOrder(this->fConstrConnect,DependenceOrder,*this->fMesh);
	
	// compute the number of statevariables
	// the number of state variables is the number of unknowns associated with
	// each shapefunction
	// numstate is best initialized during computation of the stiffness matrix
	//   TPZMaterial * mat = Material();
	//   int numstate = mat->NStateVariables();
	
	// initialize the block structure
	this->fConstrBlock.SetNBlocks(totalnodes);
	
	// toteq contains the total number of equations of the constrained matrix
	int64_t toteq = 0;
	for(in=0; in<totalnodes; in++) {
		int64_t dfnindex = this->fConstrConnect[in];
		TPZConnect &dfn = fMesh->ConnectVec()[dfnindex];
		int ndf = dfn.NDof(*fMesh);
        int ndfcheck = dfn.NState()*dfn.NShape();
        if(ndf != ndfcheck)
        {
            DebugStop();
        }
		this->fConstrBlock.Set(in,ndf);
		toteq += ndf;
	}
	
	this->fConstrBlock.Resequence();
	this->fConstrBlock.SetMatrix(&this->fConstrMat);
	    
	int64_t nrhs = this->fMat.Cols();
	if (this->fType == TPZElementMatrix::EK){
		this->fConstrMat.Redim(toteq,toteq);
	}
	else{
		this->fConstrMat.Redim(toteq,nrhs);
	}
	
	// copy the original matrix to the constrained matrix
	int numnod = this->fConnect.NElements();
	for(in=0; in<numnod; in++) {
		int irnode =0;
		int64_t idfn = this->fConnect[in];
		// find the index of the node in the destination (constrained) matrix
		while(irnode < totalnodes && this->fConstrConnect[irnode] != idfn) irnode++;
		
		// first and last rows in the original matrix
		int64_t ifirst = this->fBlock.Position(in);
		int64_t ilast = ifirst+this->fBlock.Size(in);
		
		// first and last rows in the desination (reception) matrix
		int64_t irfirst = this->fConstrBlock.Position(irnode);
		//	   int irlast = irfirst+this->fConstrBlock->Size(irnode);
		
		int64_t i,ir,ieq;
		if (this->fType == TPZElementMatrix::EF){
			for(i=ifirst,ir=irfirst;i<ilast;i++,ir++) {
				for(ieq=0; ieq<nrhs; ieq++) {
					(this->fConstrMat)(ir,ieq) = (this->fMat)(i,ieq);
				}
			}
		}
		else{
			int jn;
			for(jn=0; jn<numnod; jn++) {
				int jrnode = 0;
				int64_t jdfn = this->fConnect[jn];
				// find the index of the node in the destination (constrained) matrix
				while(jrnode < totalnodes && this->fConstrConnect[jrnode] != jdfn) jrnode++;
				if(jrnode == totalnodes) {
					LOGPZ_ERROR(logger, "node not found in node list");
				}
				// first and last columns in the original matrix
				int64_t jfirst = this->fBlock.Position(jn);
				int64_t jlast = jfirst+this->fBlock.Size(jn);
				// first and last columns in the desination (reception) matrix
				int64_t jrfirst = this->fConstrBlock.Position(jrnode);
				//int jrlast = irfirst+this->fConstrBlock->Size(jrnode);
				int64_t j,jr;
				for(i=ifirst,ir=irfirst;i<ilast; i++,ir++) {
					for(j=jfirst,jr=jrfirst;j<jlast; j++,jr++) {
						(this->fConstrMat)(ir,jr) = (this->fMat)(i,j);
					}
				}
			}
		}//else
	}
	
	int numnodes_processed = 0;
	int current_order = 0;
	while(numnodes_processed < totalnodes) {
		int in;
		for(in=0; in<totalnodes; in++) {
			int64_t dfnindex = this->fConstrConnect[in];
			TPZConnect *dfn = &(fMesh->ConnectVec()[dfnindex]);
			if(DependenceOrder[in] != current_order) continue;
			
			// only nodes which have dependency order equal to the
			// current order are processed
			numnodes_processed++;
			
			int64_t inpos = this->fConstrBlock.Position(in);
			int64_t insize = this->fConstrBlock.Size(in);
			// inpos : position of the dependent equation
			// insize : number of equations processed
			
			// loop over the nodes from which dfn depends
			TPZConnect::TPZDepend *dep = dfn->FirstDepend();
			while(dep) {
				int64_t depnodeindex = dep->fDepConnectIndex;
				// look for the index where depnode is found
				int depindex=0;
				while(depindex < totalnodes && this->fConstrConnect[depindex] != depnodeindex) depindex++;
				if(depindex == totalnodes) {
					LOGPZ_ERROR(logger,"node not found in node list");
				}
				
				int64_t deppos = this->fConstrBlock.Position(depindex);
				int64_t depsize = this->fConstrBlock.Size(depindex);
				// deppos : position of the receiving equation
				// depsize : number of receiving equations
				
				// process the rows of the constrained matrix
				int64_t send;
				int64_t receive;
				int ieq;
				STATE coef;
				int idf;
				int numstate = dfn->NState();
				for(send=inpos; send<inpos+insize; send += numstate) {
					for(receive=deppos; receive<deppos+depsize; receive += numstate) {
						coef = dep->fDepMatrix((send-inpos)/numstate,(receive-deppos)/numstate);
						if (this->fType == TPZElementMatrix::EK){
							for(ieq=0; ieq<toteq; ieq++) for(idf=0; idf<numstate; idf++)  {
								(this->fConstrMat)(receive+idf,ieq) += coef*(this->fConstrMat)(send+idf,ieq);
							}
						}//EK
						else{
							for(ieq=0; ieq<nrhs; ieq++) for(idf=0; idf<numstate; idf++) {
								(this->fConstrMat)(receive+idf,ieq) += coef*(this->fConstrMat)(send+idf,ieq);
							}
						}//EF
					}
				}
				
				if (this->fType == TPZElementMatrix::EK){
					for(send=inpos; send<inpos+insize; send += numstate) {
						for(receive=deppos; receive<deppos+depsize; receive += numstate) {
							coef = dep->fDepMatrix((send-inpos)/numstate,(receive-deppos)/numstate);
							for(ieq=0; ieq<toteq; ieq++) for(idf=0; idf<numstate; idf++) {
								(this->fConstrMat)(ieq,receive+idf) += coef*(this->fConstrMat)(ieq,send+idf);
							}
						}
					}
				}//EK
				
				dep = dep->fNext;
			} // end of while
            
            /// check whether the connect has a one shape restraint
            if (fOneRestraints.size())
            {
                ApplyOneShapeConstraints(in);
            }
            
            
		} // end of loop over all nodes
		current_order++;
	} // end of while loop
}